

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath __thiscall testing::internal::FilePath::RemoveExtension(FilePath *this,char *extension)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  undefined8 in_RDX;
  size_t extraout_RDX;
  FilePath FVar4;
  String local_50 [2];
  undefined1 local_30 [8];
  String dot_extension;
  char *extension_local;
  FilePath *this_local;
  
  String::Format((String *)local_30,".%s",in_RDX);
  pcVar2 = String::c_str((String *)local_30);
  bVar1 = String::EndsWithCaseInsensitive((String *)extension,pcVar2);
  if (bVar1) {
    pcVar2 = String::c_str((String *)extension);
    sVar3 = String::length((String *)extension);
    String::String(local_50,pcVar2,sVar3 - 4);
    FilePath(this,local_50);
    String::~String(local_50);
  }
  else {
    FilePath(this,(FilePath *)extension);
  }
  String::~String((String *)local_30);
  FVar4.pathname_.length_ = extraout_RDX;
  FVar4.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar4.pathname_;
}

Assistant:

FilePath FilePath::RemoveExtension(const char* extension) const {
  String dot_extension(String::Format(".%s", extension));
  if (pathname_.EndsWithCaseInsensitive(dot_extension.c_str())) {
    return FilePath(String(pathname_.c_str(), pathname_.length() - 4));
  }
  return *this;
}